

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

Def * __thiscall hdc::Parser::parse_def(Parser *this)

{
  Token *pTVar1;
  pointer pcVar2;
  bool bVar3;
  Def *this_00;
  Type *pTVar4;
  CompoundStatement *statements;
  Token name;
  undefined1 local_90 [16];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  char local_40 [16];
  
  this_00 = (Def *)operator_new(0xb8);
  Def::Def(this_00);
  expect(this,TK_DEF);
  expect(this,TK_ID);
  pTVar1 = (this->matched)._M_current;
  local_60._8_4_ = pTVar1->column;
  local_60._0_4_ = pTVar1->kind;
  local_60._4_4_ = pTVar1->line;
  pcVar2 = (pTVar1->lexem)._M_dataplus._M_p;
  local_50._M_p = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (pTVar1->lexem)._M_string_length);
  Def::setName(this_00,(Token *)local_60);
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  expect(this,TK_COLON);
  pTVar4 = parse_type(this);
  Def::setReturnType(this_00,pTVar4);
  expect(this,TK_NEWLINE);
  expect(this,TK_BEGIN);
  bVar3 = hasParameters(this);
  if (bVar3) {
    do {
      match(this,TK_AT);
      local_78 = 0;
      local_70._M_local_buf[0] = '\0';
      local_80._M_p = (pointer)&local_70;
      expect(this,TK_ID);
      pTVar1 = (this->matched)._M_current;
      local_90._8_4_ = pTVar1->column;
      local_90._0_4_ = pTVar1->kind;
      local_90._4_4_ = pTVar1->line;
      std::__cxx11::string::_M_assign((string *)&local_80);
      expect(this,TK_COLON);
      pTVar4 = parse_type(this);
      expect(this,TK_NEWLINE);
      Def::addParameter(this_00,(Token *)local_90,pTVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_p != &local_70) {
        operator_delete(local_80._M_p);
      }
      bVar3 = hasParameters(this);
    } while (bVar3);
  }
  statements = parse_statements(this);
  Def::setStatements(this_00,statements);
  expect(this,TK_END);
  return this_00;
}

Assistant:

Def* Parser::parse_def() {
    Def* def = new Def();

    expect(TK_DEF);
    expect(TK_ID);

    def->setName(*matched);

    expect(TK_COLON);
    def->setReturnType(parse_type());

    expect(TK_NEWLINE);
    expect(TK_BEGIN);

    while (hasParameters()) {
    //while (match(TK_AT)) {
        match(TK_AT);
        Token name;
        Type* ptype;

        expect(TK_ID);
        name = *matched;

        expect(TK_COLON);
        ptype = parse_type();
        expect(TK_NEWLINE);

        def->addParameter(name, ptype);
    }

    def->setStatements(parse_statements());
    expect(TK_END);

    return def;
}